

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall
djb::brdf::sample(brdf *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf_out,void *user_args)

{
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar1;
  float_t fVar2;
  value_type vVar3;
  _Expr<std::__detail::_BinClos<std::__divides,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  _Var4;
  undefined8 in_stack_00000008;
  _Expr<std::__detail::_BinClos<std::__divides,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  local_90 [2];
  float local_6c;
  undefined1 local_68 [4];
  float_t pdf;
  value_type fr;
  float *local_48;
  vec3 wo;
  float_t *pdf_out_local;
  vec3 *wo_out_local;
  vec3 *wi_local;
  vec2 *u_local;
  brdf *this_local;
  
  fVar2 = 0.0;
  unique0x10000129 = (float *)user_args;
  if (wo_out->z <= 0.0) {
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this);
    pfVar1 = extraout_RDX_00;
  }
  else {
    fr._M_data = (float *)(**(code **)((long)*u + 0x30))(u,wi,wo_out,0);
    local_48 = fr._M_data;
    wo.x = fVar2;
    (**(code **)*u)(local_68,u,wo_out,&local_48,in_stack_00000008);
    local_6c = (float)(**(code **)((long)*u + 0x28))(u,wo_out,&local_48,in_stack_00000008);
    if (pdf_out != (float_t *)0x0) {
      *(float **)pdf_out = local_48;
      pdf_out[2] = wo.x;
    }
    if (stack0xffffffffffffffc8 != (float *)0x0) {
      *stack0xffffffffffffffc8 = local_6c;
    }
    if (local_6c <= 0.0) {
      (**(code **)((long)*u + 0x10))(this);
    }
    else {
      _Var4 = std::operator/((valarray<float> *)local_68,&local_6c);
      local_90[0]._M_closure.super__BinBase2<std::__divides,_std::valarray<float>_>._M_expr1 =
           _Var4._M_closure.super__BinBase2<std::__divides,_std::valarray<float>_>._M_expr1;
      local_90[0]._M_closure.super__BinBase2<std::__divides,_std::valarray<float>_>._M_expr2 =
           _Var4._M_closure.super__BinBase2<std::__divides,_std::valarray<float>_>._M_expr2;
      std::valarray<float>::
      valarray<std::__detail::_BinClos<std::__divides,std::_ValArray,std::_Constant,float,float>>
                ((valarray<float> *)this,local_90);
    }
    std::valarray<float>::~valarray((valarray<float> *)local_68);
    pfVar1 = extraout_RDX;
  }
  vVar3._M_data = pfVar1;
  vVar3._M_size = (size_t)this;
  return vVar3;
}

Assistant:

brdf::value_type
brdf::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf_out,
	const void *user_args
) const {
	if (wi.z > 0) {
		vec3 wo = u2_to_s2(u, wi);
		brdf::value_type fr = eval(wi, wo, user_args);
		float_t pdf = this->pdf(wi, wo, user_args);

		if (wo_out) (*wo_out) = wo;
		if (pdf_out) (*pdf_out) = pdf;

		return pdf > 0 ? fr / pdf : zero_value();
	} else {
		if (pdf_out) (*pdf_out) = 0;

		return zero_value();
	}
}